

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

Slice __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::value
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  uint uVar2;
  Slice SVar3;
  byte bVar4;
  byte *pbVar5;
  
  SVar3._start = *(uint8_t **)this;
  if ((*SVar3._start & 0xfe) == 0xee) {
    bVar4 = 0;
    pbVar5 = SVar3._start;
    do {
      bVar1 = *pbVar5;
      if ((bVar1 & 0xfe) != 0xee) break;
      uVar2 = (uint)(bVar1 == 0xef) * 9;
      if (bVar1 == 0xee) {
        uVar2 = 2;
      }
      bVar4 = bVar4 + (char)uVar2;
      pbVar5 = pbVar5 + uVar2;
    } while (uVar2 != 0);
    SVar3._start = SVar3._start + bVar4;
  }
  return (Slice)SVar3._start;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }